

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blif_parser.cpp
# Opt level: O2

void __thiscall Blif::pushAllNodes(Blif *this,string *s)

{
  __normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_> __last;
  Node *pNVar1;
  __normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_> _Var2;
  string local_110;
  string local_f0 [32];
  Node local_d0;
  
  _Var2._M_current =
       (this->_allNodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (this->_allNodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::__cxx11::string::string(local_f0,(string *)s);
  _Var2 = std::
          find_if<__gnu_cxx::__normal_iterator<Node*,std::vector<Node,std::allocator<Node>>>,Blif::pushAllNodes(std::__cxx11::string)::_lambda(Node&)_1_>
                    (_Var2,__last,(anon_class_32_1_54a39813_for__M_pred *)local_f0);
  pNVar1 = (this->_allNodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::__cxx11::string::~string(local_f0);
  if (_Var2._M_current == pNVar1) {
    std::__cxx11::string::string((string *)&local_110,(string *)s);
    Node::Node(&local_d0,&local_110,false);
    std::vector<Node,_std::allocator<Node>_>::emplace_back<Node>(&this->_allNodes,&local_d0);
    Node::~Node(&local_d0);
    std::__cxx11::string::~string((string *)&local_110);
  }
  return;
}

Assistant:

void pushAllNodes(string s) {
    if (find_if(begin(this->_allNodes), end(this->_allNodes), [=] (Node& n) { return n.node() == s; }) == end(this->_allNodes)) {
      this->_allNodes.push_back(Node(s, false)); // all nodes stores only relation information, negate can be ignored
    }
  }